

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::
UntypedPerformAction
          (FunctionMockerBase<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> *pAVar1;
  undefined1 local_28 [8];
  Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> action;
  
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  ::linked_ptr((linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                *)local_28,
               (linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                *)untyped_action);
  pAVar1 = ActionResultHolder<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>::
           PerformAction<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>
                     ((Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
                       *)local_28,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                 *)local_28);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }